

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O0

void __thiscall CEPlanet::CEPlanet(CEPlanet *this,CEPlanet *other)

{
  CEPlanet *in_RSI;
  string *in_RDI;
  CEPlanet *unaff_retaddr;
  CEPlanet *this_00;
  undefined1 local_31 [49];
  
  this_00 = (CEPlanet *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"",(allocator *)this_00);
  CEBody::CEBody(&this_00->super_CEBody,&in_RSI->super_CEBody,in_RDI);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  *(undefined ***)in_RDI = &PTR__CEPlanet_00179b30;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x15d113);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x15d129);
  *(undefined8 *)((long)&in_RDI[8].field_2 + 8) = 0x3eb0c6f7a0b5ed8d;
  init_members(unaff_retaddr);
  copy_members(this_00,in_RSI);
  return;
}

Assistant:

CEPlanet::CEPlanet(const CEPlanet& other) :
    CEBody(other)
{
    init_members();
    copy_members(other);
}